

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cd_hull.cpp
# Opt level: O1

Plane * __thiscall
ConvexDecomposition::Array<ConvexDecomposition::Plane>::Add
          (Array<ConvexDecomposition::Plane> *this,Plane t)

{
  int iVar1;
  Plane PVar2;
  int s;
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  
  auVar4._8_56_ = t._16_56_;
  auVar4._0_8_ = t._8_8_;
  auVar3._8_56_ = t._8_56_;
  auVar3._0_8_ = t.normal._0_8_;
  iVar1 = this->array_size;
  if (this->count <= iVar1) {
    if (this->count == iVar1) {
      s = 0x10;
      if (iVar1 != 0) {
        s = iVar1 * 2;
      }
      allocate(this,s);
    }
    iVar1 = this->count;
    this->count = iVar1 + 1;
    PVar2 = (Plane)vmovlhps_avx(auVar3._0_16_,auVar4._0_16_);
    this->element[iVar1] = PVar2;
    return this->element + (long)this->count + -1;
  }
  __assert_fail("count<=array_size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                ,0x5e8,
                "Type &ConvexDecomposition::Array<ConvexDecomposition::Plane>::Add(Type) [Type = ConvexDecomposition::Plane]"
               );
}

Assistant:

Type& Array<Type>::Add(Type t)
{
	assert(count<=array_size);
	if(count==array_size)
	{
		allocate((array_size)?array_size *2:16);
	}
	element[count++] = t;
	return element[count-1];
}